

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

void __thiscall lf::base::Timer::Stop(Timer *this)

{
  cpu_times current;
  cpu_times local_28;
  
  if (this->is_stopped_ == false) {
    this->is_stopped_ = true;
    anon_unknown.dwarf_754f7::get_cpu_times(&local_28);
    (this->times_).wall.__r = local_28.wall.__r - (this->times_).wall.__r;
    (this->times_).user.__r = local_28.user.__r - (this->times_).user.__r;
    (this->times_).system.__r = local_28.system.__r - (this->times_).system.__r;
  }
  return;
}

Assistant:

void Timer::Stop() noexcept {
  if (IsStopped()) {
    return;
  }
  is_stopped_ = true;

  cpu_times current;  // NOLINT
  get_cpu_times(&current);
  times_.wall = (current.wall - times_.wall);
  times_.user = (current.user - times_.user);
  times_.system = (current.system - times_.system);
}